

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_suite.cpp
# Opt level: O3

void partial_suite::format_boolean(void)

{
  string result;
  writer writer;
  basic_formatter<char,_std::allocator<char>_> vis;
  variable data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  type local_88;
  void *local_70;
  long local_60;
  basic_formatter<char,_std::allocator<char>_> local_50;
  type local_48;
  undefined1 local_28;
  
  local_28 = 1;
  local_48.__data[0] = '\x01';
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  trial::protocol::json::basic_writer<char,16ul>::basic_writer<std::__cxx11::string>
            ((basic_writer<char,16ul> *)&local_88.__align,&local_a8);
  trial::protocol::json::basic_writer<char,_16UL>::begin_array_value
            ((basic_writer<char,_16UL> *)&local_88.__align);
  local_50.writer = (basic_writer<char,_16UL> *)&local_88;
  trial::dynamic::
  visit<trial::protocol::json::detail::basic_formatter<char,std::allocator<char>>&,std::allocator<char>>
            (&local_50,(basic_variable<std::allocator<char>_> *)&local_48.__align);
  trial::protocol::json::basic_writer<char,_16UL>::end_array_value
            ((basic_writer<char,_16UL> *)&local_88.__align);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[7]>
            ("result","\"[true]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/format_suite.cpp"
             ,0xcc,"void partial_suite::format_boolean()",&local_a8,"[true]");
  if (local_70 != (void *)0x0) {
    operator_delete(local_70,local_60 - (long)local_70);
  }
  (**(code **)local_88._0_8_)();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48.__align);
  return;
}

Assistant:

void format_boolean()
{
    variable data(true);
    std::string result;
    json::writer writer(result);
    writer.value<json::token::begin_array>();
    json::partial::format(data, writer);
    writer.value<json::token::end_array>();
    TRIAL_PROTOCOL_TEST_EQUAL(result, "[true]");
}